

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QByteArray *
QtStringBuilder::appendToByteArray<QStringBuilder<char_const(&)[11],QByteArray>,char_const(&)[4]>
          (QByteArray *a,
          QStringBuilder<QStringBuilder<const_char_(&)[11],_QByteArray>,_const_char_(&)[4]> *b,
          char param_3)

{
  ArrayOptions *pAVar1;
  Data *pDVar2;
  size_t __n;
  char (*pacVar3) [4];
  char *pcVar4;
  char cVar5;
  long lVar6;
  char *__dest;
  long lVar7;
  
  pDVar2 = (a->d).d;
  lVar7 = (a->d).size;
  lVar6 = (b->a).b.d.size;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData((longlong)a,(AllocationOption)lVar7);
  }
  lVar7 = lVar7 + lVar6 + 0xd;
  pDVar2 = (a->d).d;
  if (pDVar2 == (Data *)0x0) {
    lVar6 = 0;
  }
  else {
    lVar6 = (((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) +
            (pDVar2->super_QArrayData).alloc) - (long)((a->d).ptr + (a->d).size);
  }
  if (lVar6 < lVar7) {
    if (pDVar2 == (Data *)0x0) {
      lVar6 = 0;
    }
    else {
      lVar6 = (pDVar2->super_QArrayData).alloc * 2;
    }
    if (lVar6 < lVar7) {
      lVar6 = lVar7;
    }
    if (((pDVar2 == (Data *)0x0) ||
        (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
       ((long)((((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) +
               (pDVar2->super_QArrayData).alloc) - (long)(a->d).ptr) < lVar6)) {
      lVar7 = (a->d).size;
      if (lVar6 < lVar7) {
        lVar6 = lVar7;
      }
      QByteArray::reallocData((longlong)a,(AllocationOption)lVar6);
    }
    pDVar2 = (a->d).d;
    if ((pDVar2 != (Data *)0x0) && ((pDVar2->super_QArrayData).alloc != 0)) {
      pAVar1 = &(pDVar2->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
  }
  pDVar2 = (a->d).d;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData((longlong)a,(AllocationOption)(a->d).size);
  }
  __dest = (a->d).ptr + (a->d).size;
  pcVar4 = *(b->a).a;
  cVar5 = *pcVar4;
  while (cVar5 != '\0') {
    pcVar4 = pcVar4 + 1;
    *__dest = cVar5;
    __dest = __dest + 1;
    cVar5 = *pcVar4;
  }
  __n = (b->a).b.d.size;
  if (__n != 0) {
    memcpy(__dest,(b->a).b.d.ptr,__n);
  }
  pacVar3 = b->b;
  cVar5 = (*pacVar3)[0];
  if (cVar5 != '\0') {
    lVar7 = 0;
    do {
      __dest[lVar7 + __n] = cVar5;
      cVar5 = (*pacVar3)[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while (cVar5 != '\0');
  }
  QByteArray::resize((longlong)a);
  return a;
}

Assistant:

QByteArray &appendToByteArray(QByteArray &a, const QStringBuilder<A, B> &b, char)
{
    // append 8-bit data to a byte array
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    char *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    a.resize(len); //we need to resize after the appendTo for the case str+=foo+str
    return a;
}